

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l2_norm(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  quad *pqVar3;
  int i_1;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pfVar2 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  auVar7 = ZEXT816(0) << 0x40;
  uVar4 = 0;
  while ((uint)n != uVar4) {
    pfVar1 = pfVar2 + uVar4;
    uVar4 = uVar4 + 1;
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)*pfVar1),ZEXT416((uint)*pfVar1));
  }
  uVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  uVar5 = 0;
  while (uVar4 != uVar5) {
    pqVar3 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl + uVar5;
    uVar5 = uVar5 + 1;
    auVar8 = ZEXT416((uint)pqVar3->factor);
    auVar7 = vfmadd231ss_fma(auVar7,auVar8,auVar8);
  }
  fVar6 = auVar7._0_4_;
  if ((int)ABS(fVar6) - 0x800000U < 0x7f000000) {
    for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
      pfVar2[uVar5] = pfVar2[uVar5] / fVar6;
    }
    pqVar3 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pqVar3[uVar5].factor = pqVar3[uVar5].factor / fVar6;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }